

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void snap_restoredata(GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref,void *dst,
                     CTSize sz)

{
  char *pcVar1;
  IRIns *pIVar2;
  IRIns *pIVar3;
  ulong uVar4;
  uint uVar5;
  IRIns local_20;
  
  pIVar3 = T->ir;
  uVar4 = (ulong)ref;
  pIVar2 = pIVar3 + uVar4;
  if (ref < 0x8000) {
    if ((byte)((pIVar2->field_1).o - 0x1b) < 2) {
      rfilt = (BloomFilter)(ulong)(pIVar2->field_1).op12;
      goto LAB_00141375;
    }
    rfilt = (BloomFilter)pIVar2;
    if (sz != 8) goto LAB_00141375;
    uVar5 = (pIVar2->field_1).op12;
  }
  else {
    uVar5 = (uint)*(ushort *)((long)pIVar3 + uVar4 * 8 + 6);
    if (((rfilt >> (uVar4 & 0x3f) & 1) != 0) &&
       (uVar4 = (ulong)(T->nins - 1), *(char *)((long)pIVar3 + uVar4 * 8 + 5) == '\x14')) {
      pIVar3 = pIVar3 + uVar4;
      do {
        if (((pIVar3->field_0).op1 == ref) && ((pIVar3->field_0).op2 <= snapno)) {
          uVar5 = (uint)(pIVar3->field_0).prev;
        }
        pcVar1 = (char *)((long)pIVar3 + -3);
        pIVar3 = pIVar3 + -1;
      } while (*pcVar1 == '\x14');
    }
    if (uVar5 < 0x100) {
      if (uVar5 < 0x80) {
        rfilt = (BloomFilter)(ex->fpr + (uVar5 - 0x10));
        if (uVar5 < 0x10) {
          rfilt = (BloomFilter)(ex->gpr + uVar5);
        }
      }
      else {
        snap_restoredata(T,ex,snapno,rfilt,(uint)(pIVar2->field_0).op1,dst,4);
        *(double *)dst = (double)*dst;
      }
      if (0x7f < uVar5) {
        return;
      }
      goto LAB_00141375;
    }
    rfilt = (BloomFilter)(ex->spill + (uVar5 >> 8));
    if ((sz != 8) ||
       (uVar5._0_2_ = *(IROpT *)((long)pIVar2 + 4), uVar5._2_2_ = *(IRRef1 *)((long)pIVar2 + 6),
       (0x604208U >> (uVar5 & 0x1f) & 1) != 0)) goto LAB_00141375;
    uVar5 = ((anon_struct_8_5_4e98db7e_for_IRIns_2 *)rfilt)->op12;
  }
  local_20._4_4_ = 0;
  local_20.field_1.op12 = uVar5;
  rfilt = (BloomFilter)&local_20;
LAB_00141375:
  if (sz == 1) {
    *(undefined1 *)dst = *(undefined1 *)rfilt;
  }
  else if (sz == 8) {
    *(anon_struct_8_4_c535eab0_for_IRIns_0 *)dst = *(anon_struct_8_4_c535eab0_for_IRIns_0 *)rfilt;
  }
  else if (sz == 4) {
    *(IRRef2 *)dst = ((anon_struct_8_5_4e98db7e_for_IRIns_2 *)rfilt)->op12;
  }
  else {
    *(IRRef1 *)dst = ((anon_struct_8_4_c535eab0_for_IRIns_0 *)rfilt)->op1;
  }
  return;
}

Assistant:

static void snap_restoredata(GCtrace *T, ExitState *ex,
			     SnapNo snapno, BloomFilter rfilt,
			     IRRef ref, void *dst, CTSize sz)
{
  IRIns *ir = &T->ir[ref];
  RegSP rs = ir->prev;
  int32_t *src;
  uint64_t tmp;
  if (irref_isk(ref)) {
    if (ir->o == IR_KNUM || ir->o == IR_KINT64) {
      src = mref(ir->ptr, int32_t);
    } else if (sz == 8) {
      tmp = (uint64_t)(uint32_t)ir->i;
      src = (int32_t *)&tmp;
    } else {
      src = &ir->i;
    }
  } else {
    if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
      rs = snap_renameref(T, snapno, ref, rs);
    if (ra_hasspill(regsp_spill(rs))) {
      src = &ex->spill[regsp_spill(rs)];
      if (sz == 8 && !irt_is64(ir->t)) {
	tmp = (uint64_t)(uint32_t)*src;
	src = (int32_t *)&tmp;
      }
    } else {
      Reg r = regsp_reg(rs);
      if (ra_noreg(r)) {
	/* Note: this assumes CNEWI is never used for SOFTFP split numbers. */
	lua_assert(sz == 8 && ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
	snap_restoredata(T, ex, snapno, rfilt, ir->op1, dst, 4);
	*(lua_Number *)dst = (lua_Number)*(int32_t *)dst;
	return;
      }
      src = (int32_t *)&ex->gpr[r-RID_MIN_GPR];
#if !LJ_SOFTFP
      if (r >= RID_MAX_GPR) {
	src = (int32_t *)&ex->fpr[r-RID_MIN_FPR];
#if LJ_TARGET_PPC
	if (sz == 4) {  /* PPC FPRs are always doubles. */
	  *(float *)dst = (float)*(double *)src;
	  return;
	}
#else
	if (LJ_BE && sz == 4) src++;
#endif
      }
#endif
    }
  }
  lua_assert(sz == 1 || sz == 2 || sz == 4 || sz == 8);
  if (sz == 4) *(int32_t *)dst = *src;
  else if (sz == 8) *(int64_t *)dst = *(int64_t *)src;
  else if (sz == 1) *(int8_t *)dst = (int8_t)*src;
  else *(int16_t *)dst = (int16_t)*src;
}